

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::StoreTest::StoreTest
          (StoreTest *this,TestContext *testCtx,string *name,string *description,Texture *texture,
          VkFormat format,deUint32 flags)

{
  VkFormat format_local;
  Texture *texture_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  StoreTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StoreTest_016af3d8;
  Texture::Texture(&this->m_texture,texture);
  this->m_format = format;
  this->m_declareImageFormatInShader = (flags & 2) != 0;
  this->m_singleLayerBind = (flags & 1) != 0;
  return;
}

Assistant:

StoreTest::StoreTest (tcu::TestContext&		testCtx,
					  const std::string&	name,
					  const std::string&	description,
					  const Texture&		texture,
					  const VkFormat		format,
					  const deUint32		flags)
	: TestCase						(testCtx, name, description)
	, m_texture						(texture)
	, m_format						(format)
	, m_declareImageFormatInShader	((flags & FLAG_DECLARE_IMAGE_FORMAT_IN_SHADER) != 0)
	, m_singleLayerBind				((flags & FLAG_SINGLE_LAYER_BIND) != 0)
{
	if (m_singleLayerBind)
		DE_ASSERT(m_texture.numLayers() > 1);
}